

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

opj_sparse_array_int32_t * opj_dwt_init_sparse_array(opj_tcd_tilecomp_t *tilec,OPJ_UINT32 numres)

{
  int iVar1;
  int iVar2;
  opj_tcd_resolution_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  opj_tcd_cblk_enc_t *poVar5;
  OPJ_INT32 *src;
  OPJ_BOOL OVar6;
  opj_sparse_array_int32_t *sa;
  ulong uVar7;
  ulong uVar8;
  OPJ_UINT32 OVar9;
  long lVar10;
  uint uVar11;
  OPJ_UINT32 OVar12;
  uint width;
  OPJ_UINT32 src_line_stride;
  ulong uVar13;
  opj_tcd_band_t *poVar14;
  ulong local_68;
  
  poVar3 = tilec->resolutions;
  uVar11 = numres - 1;
  width = poVar3[uVar11].x1 - poVar3[uVar11].x0;
  uVar11 = poVar3[uVar11].y1 - poVar3[uVar11].y0;
  OVar12 = 0x40;
  if (width < 0x40) {
    OVar12 = width;
  }
  OVar9 = 0x40;
  if (uVar11 < 0x40) {
    OVar9 = uVar11;
  }
  sa = opj_sparse_array_int32_create(width,uVar11,OVar12,OVar9);
  if (sa == (opj_sparse_array_int32_t *)0x0) {
LAB_0010d2d1:
    sa = (opj_sparse_array_int32_t *)0x0;
  }
  else if (numres != 0) {
    uVar8 = 0;
    do {
      poVar3 = tilec->resolutions;
      if (poVar3[uVar8].numbands != 0) {
        uVar11 = (int)uVar8 - 1;
        local_68 = 0;
        do {
          if (poVar3[uVar8].ph * poVar3[uVar8].pw != 0) {
            poVar14 = poVar3[uVar8].bands + local_68;
            uVar7 = 0;
            do {
              poVar4 = poVar14->precincts;
              if (poVar4[uVar7].ch * poVar4[uVar7].cw != 0) {
                lVar10 = 0x10;
                uVar13 = 0;
                do {
                  poVar5 = poVar4[uVar7].cblks.enc;
                  src = *(OPJ_INT32 **)((long)&poVar5->data_size + lVar10);
                  if (src != (OPJ_INT32 *)0x0) {
                    iVar1 = *(int *)((long)&poVar5->data + lVar10);
                    OVar12 = iVar1 - poVar14->x0;
                    if ((poVar14->bandno & 1) != 0) {
                      OVar12 = (OVar12 + tilec->resolutions[uVar11].x1) -
                               tilec->resolutions[uVar11].x0;
                    }
                    iVar2 = *(int *)((long)&poVar5->data + lVar10 + 4);
                    OVar9 = iVar2 - poVar14->y0;
                    if ((poVar14->bandno & 2) != 0) {
                      OVar9 = (OVar9 + tilec->resolutions[uVar11].y1) -
                              tilec->resolutions[uVar11].y0;
                    }
                    src_line_stride = *(int *)((long)&poVar5->layers + lVar10) - iVar1;
                    OVar6 = opj_sparse_array_int32_write
                                      (sa,OVar12,OVar9,OVar12 + src_line_stride,
                                       (*(int *)((long)&poVar5->layers + lVar10 + 4) - iVar2) +
                                       OVar9,src,1,src_line_stride,1);
                    if (OVar6 == 0) {
                      opj_sparse_array_int32_free(sa);
                      goto LAB_0010d2d1;
                    }
                  }
                  uVar13 = uVar13 + 1;
                  lVar10 = lVar10 + 0x48;
                } while (uVar13 < poVar4[uVar7].ch * poVar4[uVar7].cw);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < poVar3[uVar8].ph * poVar3[uVar8].pw);
          }
          local_68 = local_68 + 1;
        } while (local_68 < poVar3[uVar8].numbands);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != numres);
  }
  return sa;
}

Assistant:

static opj_sparse_array_int32_t* opj_dwt_init_sparse_array(
    opj_tcd_tilecomp_t* tilec,
    OPJ_UINT32 numres)
{
    opj_tcd_resolution_t* tr_max = &(tilec->resolutions[numres - 1]);
    OPJ_UINT32 w = (OPJ_UINT32)(tr_max->x1 - tr_max->x0);
    OPJ_UINT32 h = (OPJ_UINT32)(tr_max->y1 - tr_max->y0);
    OPJ_UINT32 resno, bandno, precno, cblkno;
    opj_sparse_array_int32_t* sa = opj_sparse_array_int32_create(
                                       w, h, opj_uint_min(w, 64), opj_uint_min(h, 64));
    if (sa == NULL) {
        return NULL;
    }

    for (resno = 0; resno < numres; ++resno) {
        opj_tcd_resolution_t* res = &tilec->resolutions[resno];

        for (bandno = 0; bandno < res->numbands; ++bandno) {
            opj_tcd_band_t* band = &res->bands[bandno];

            for (precno = 0; precno < res->pw * res->ph; ++precno) {
                opj_tcd_precinct_t* precinct = &band->precincts[precno];
                for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
                    opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
                    if (cblk->decoded_data != NULL) {
                        OPJ_UINT32 x = (OPJ_UINT32)(cblk->x0 - band->x0);
                        OPJ_UINT32 y = (OPJ_UINT32)(cblk->y0 - band->y0);
                        OPJ_UINT32 cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
                        OPJ_UINT32 cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);

                        if (band->bandno & 1) {
                            opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
                            x += (OPJ_UINT32)(pres->x1 - pres->x0);
                        }
                        if (band->bandno & 2) {
                            opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
                            y += (OPJ_UINT32)(pres->y1 - pres->y0);
                        }

                        if (!opj_sparse_array_int32_write(sa, x, y,
                                                          x + cblk_w, y + cblk_h,
                                                          cblk->decoded_data,
                                                          1, cblk_w, OPJ_TRUE)) {
                            opj_sparse_array_int32_free(sa);
                            return NULL;
                        }
                    }
                }
            }
        }
    }

    return sa;
}